

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O1

void __thiscall QGnomeThemePrivate::updateColorScheme(QGnomeThemePrivate *this,QString *themeName)

{
  ColorScheme CVar1;
  long lVar2;
  ColorScheme CVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  
  CVar1 = this->m_colorScheme;
  QVar4.m_data = &DAT_00000005;
  QVar4.m_size = (qsizetype)themeName;
  lVar2 = QString::indexOf(QVar4,0x6b781c,CaseInsensitive);
  CVar3 = Light;
  if (lVar2 == -1) {
    QVar5.m_data = (char *)0x4;
    QVar5.m_size = (qsizetype)themeName;
    lVar2 = QString::indexOf(QVar5,0x6d87ba,CaseInsensitive);
    CVar3 = (uint)(lVar2 != -1) * 2;
  }
  this->m_colorScheme = CVar3;
  if (CVar1 == CVar3) {
    return;
  }
  QWindowSystemInterface::handleThemeChange<QWindowSystemInterface::DefaultDelivery>();
  return;
}

Assistant:

void QGnomeThemePrivate::updateColorScheme(const QString &themeName)
{
    const auto oldColorScheme = m_colorScheme;
    if (themeName.contains(QLatin1StringView("light"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Light;
    } else if (themeName.contains(QLatin1StringView("dark"), Qt::CaseInsensitive)) {
        m_colorScheme = Qt::ColorScheme::Dark;
    } else {
        m_colorScheme = Qt::ColorScheme::Unknown;
    }

    if (oldColorScheme != m_colorScheme)
        QWindowSystemInterface::handleThemeChange();
}